

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O0

int __thiscall
zmq::ipc_listener_t::accept(ipc_listener_t *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  char *errstr_2;
  int rc_1;
  char *errstr_1;
  int rc;
  char *errstr;
  fd_t sock;
  int local_4;
  
  if ((this->super_stream_listener_base_t)._s == -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s != retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ipc_listener.cpp"
            ,0x130);
    fflush(_stderr);
    zmq_abort((char *)0x2f6fd1);
  }
  local_4 = accept4((this->super_stream_listener_base_t)._s,(sockaddr *)0x0,(socklen_t *)0x0,0x80000
                   );
  if (local_4 == -1) {
    piVar2 = __errno_location();
    bVar4 = true;
    if (*piVar2 != 0xb) {
      piVar2 = __errno_location();
      bVar4 = true;
      if (*piVar2 != 0xb) {
        piVar2 = __errno_location();
        bVar4 = true;
        if (*piVar2 != 4) {
          piVar2 = __errno_location();
          bVar4 = true;
          if (*piVar2 != 0x67) {
            piVar2 = __errno_location();
            bVar4 = true;
            if (*piVar2 != 0x47) {
              piVar2 = __errno_location();
              bVar4 = *piVar2 == 0x17;
            }
          }
        }
      }
    }
    if (!bVar4) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ipc_listener.cpp"
              ,0x147);
      fflush(_stderr);
      zmq_abort((char *)0x2f70ce);
    }
    local_4 = -1;
  }
  else {
    make_socket_noninheritable(local_4);
    bVar4 = filter((ipc_listener_t *)errstr_1,rc_1);
    if (bVar4) {
      iVar1 = set_nosigpipe(local_4);
      if (iVar1 != 0) {
        iVar1 = ::close(local_4);
        if (iVar1 != 0) {
          piVar2 = __errno_location();
          pcVar3 = strerror(*piVar2);
          fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ipc_listener.cpp"
                  ,0x15d);
          fflush(_stderr);
          zmq_abort((char *)0x2f71fb);
        }
        local_4 = -1;
      }
    }
    else {
      iVar1 = ::close(local_4);
      if (iVar1 != 0) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ipc_listener.cpp"
                ,0x152);
        fflush(_stderr);
        zmq_abort((char *)0x2f716d);
      }
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

zmq::fd_t zmq::ipc_listener_t::accept ()
{
    //  Accept one connection and deal with different failure modes.
    //  The situation where connection cannot be accepted due to insufficient
    //  resources is considered valid and treated by ignoring the connection.
    zmq_assert (_s != retired_fd);
#if defined ZMQ_HAVE_SOCK_CLOEXEC && defined HAVE_ACCEPT4
    fd_t sock = ::accept4 (_s, NULL, NULL, SOCK_CLOEXEC);
#else
    struct sockaddr_storage ss;
    memset (&ss, 0, sizeof (ss));
#if defined ZMQ_HAVE_HPUX || defined ZMQ_HAVE_VXWORKS
    int ss_len = sizeof (ss);
#else
    socklen_t ss_len = sizeof (ss);
#endif

    const fd_t sock =
      ::accept (_s, reinterpret_cast<struct sockaddr *> (&ss), &ss_len);
#endif
    if (sock == retired_fd) {
#if defined ZMQ_HAVE_WINDOWS
        const int last_error = WSAGetLastError ();
        wsa_assert (last_error == WSAEWOULDBLOCK || last_error == WSAECONNRESET
                    || last_error == WSAEMFILE || last_error == WSAENOBUFS);
#else
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == ENFILE);
#endif
        return retired_fd;
    }

    make_socket_noninheritable (sock);

    // IPC accept() filters
#if defined ZMQ_HAVE_SO_PEERCRED || defined ZMQ_HAVE_LOCAL_PEERCRED
    if (!filter (sock)) {
        int rc = ::close (sock);
        errno_assert (rc == 0);
        return retired_fd;
    }
#endif

    if (zmq::set_nosigpipe (sock)) {
#ifdef ZMQ_HAVE_WINDOWS
        const int rc = closesocket (sock);
        wsa_assert (rc != SOCKET_ERROR);
#else
        int rc = ::close (sock);
        errno_assert (rc == 0);
#endif
        return retired_fd;
    }

    return sock;
}